

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader.cpp
# Opt level: O1

bool __thiscall
BamTools::BamReader::SetRegion
          (BamReader *this,int *leftRefID,int *leftBound,int *rightRefID,int *rightBound)

{
  bool bVar1;
  BamRegion local_10;
  
  local_10.LeftRefID = *leftRefID;
  local_10.LeftPosition = *leftBound;
  local_10.RightRefID = *rightRefID;
  local_10.RightPosition = *rightBound;
  bVar1 = Internal::BamReaderPrivate::SetRegion(this->d,&local_10);
  return bVar1;
}

Assistant:

bool BamReader::SetRegion(const int& leftRefID, const int& leftBound, const int& rightRefID,
                          const int& rightBound)
{
    return d->SetRegion(BamRegion(leftRefID, leftBound, rightRefID, rightBound));
}